

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall
cmCTest::GenerateCTestNotesOutput(cmCTest *this,cmXMLWriter *xml,VectorOfStrings *files)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *psVar4;
  reference value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string local_850 [32];
  undefined1 local_830 [8];
  ostringstream cmCTestLog_msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  undefined1 local_678 [8];
  string line;
  ifstream ifs;
  allocator local_449;
  string local_448;
  allocator local_421;
  string local_420;
  double local_400;
  allocator local_3f1;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  undefined1 local_3a8 [8];
  string note_time;
  undefined1 local_368 [8];
  ostringstream cmCTestLog_msg;
  __normal_iterator<const_cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
  local_1f0;
  String *local_1e8;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  allocator local_169;
  string local_168;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator local_c1;
  string local_c0;
  __normal_iterator<const_cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
  local_a0;
  const_iterator it;
  allocator local_81;
  string local_80;
  string local_60;
  undefined1 local_40 [8];
  string buildname;
  VectorOfStrings *files_local;
  cmXMLWriter *xml_local;
  cmCTest *this_local;
  
  buildname.field_2._8_8_ = files;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"BuildName",&local_81);
  GetCTestConfiguration(&local_60,this,&local_80);
  SafeBuildIdField((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  __gnu_cxx::
  __normal_iterator<const_cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
  ::__normal_iterator(&local_a0);
  cmXMLWriter::StartDocument(xml,"UTF-8");
  cmXMLWriter::ProcessingInstruction
            (xml,"xml-stylesheet",
             "type=\"text/xsl\" href=\"Dart/Source/Server/XSL/Build.xsl <file:///Dart/Source/Server/XSL/Build.xsl> \""
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"Site",&local_c1);
  cmXMLWriter::StartElement(xml,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  cmXMLWriter::Attribute<std::__cxx11::string>
            (xml,"BuildName",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::operator+(&local_108,&this->CurrentTag,"-");
  GetTestModelString_abi_cxx11_(&local_128,this);
  std::operator+(&local_e8,&local_108,&local_128);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"BuildStamp",&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"Site",&local_169);
  GetCTestConfiguration(&local_148,this,&local_168);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"Name",&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"ctest",&local_1b1);
  pcVar2 = cmVersion::GetCMakeVersion();
  std::operator+(&local_190,&local_1b0,pcVar2);
  cmXMLWriter::Attribute<std::__cxx11::string>(xml,"Generator",&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  AddSiteProperties(this,xml);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"Notes",&local_1d9);
  cmXMLWriter::StartElement(xml,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  local_1e8 = (String *)
              std::vector<cmsys::String,_std::allocator<cmsys::String>_>::begin
                        ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                         buildname.field_2._8_8_);
  local_a0._M_current = local_1e8;
  while( true ) {
    local_1f0._M_current =
         (String *)
         std::vector<cmsys::String,_std::allocator<cmsys::String>_>::end
                   ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)buildname.field_2._8_8_
                   );
    bVar1 = __gnu_cxx::operator!=(&local_a0,&local_1f0);
    if (!bVar1) break;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
    poVar3 = std::operator<<((ostream *)local_368,"\tAdd file: ");
    psVar4 = (string *)
             __gnu_cxx::
             __normal_iterator<const_cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
             ::operator*(&local_a0);
    poVar3 = std::operator<<(poVar3,psVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x674,pcVar2,false);
    std::__cxx11::string::~string((string *)(note_time.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
    CurrentTime_abi_cxx11_((string *)local_3a8,this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3c8,"Note",&local_3c9);
    cmXMLWriter::StartElement(xml,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
    value = __gnu_cxx::
            __normal_iterator<const_cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
            ::operator*(&local_a0);
    cmXMLWriter::Attribute<cmsys::String>(xml,"Name",value);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f0,"Time",&local_3f1);
    local_400 = cmsys::SystemTools::GetTime();
    cmXMLWriter::Element<double>(xml,&local_3f0,&local_400);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_420,"DateTime",&local_421);
    cmXMLWriter::Element<std::__cxx11::string>
              (xml,&local_420,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a8);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator((allocator<char> *)&local_421);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_448,"Text",&local_449);
    cmXMLWriter::StartElement(xml,&local_448);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
    __gnu_cxx::
    __normal_iterator<const_cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
    ::operator->(&local_a0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream((void *)((long)&line.field_2 + 8),pcVar2,_S_in);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&line.field_2 + *(long *)(line.field_2._8_8_ + -0x18) + 8));
    if (bVar1) {
      std::__cxx11::string::string((string *)local_678);
      while( true ) {
        bVar1 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)(line.field_2._M_local_buf + 8),(string *)local_678,
                           (bool *)0x0,-1);
        if (!bVar1) break;
        cmXMLWriter::Content<std::__cxx11::string>
                  (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_678);
        cmXMLWriter::Content<char[2]>(xml,(char (*) [2])0xace1c5);
      }
      std::ifstream::close();
      std::__cxx11::string::~string((string *)local_678);
    }
    else {
      __rhs = &__gnu_cxx::
               __normal_iterator<const_cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
               ::operator*(&local_a0)->super_string;
      std::operator+(&local_6b8,"Problem reading file: ",__rhs);
      std::operator+(&local_698,&local_6b8,"\n");
      cmXMLWriter::Content<std::__cxx11::string>(xml,&local_698);
      std::__cxx11::string::~string((string *)&local_698);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_830);
      poVar3 = std::operator<<((ostream *)local_830,"Problem reading file: ");
      psVar4 = (string *)
               __gnu_cxx::
               __normal_iterator<const_cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
               ::operator*(&local_a0);
      poVar3 = std::operator<<(poVar3,psVar4);
      poVar3 = std::operator<<(poVar3," while creating notes");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar2 = (char *)std::__cxx11::string::c_str();
      Log(this,6,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
          ,0x68a,pcVar2,false);
      std::__cxx11::string::~string(local_850);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_830);
    }
    cmXMLWriter::EndElement(xml);
    cmXMLWriter::EndElement(xml);
    std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
    std::__cxx11::string::~string((string *)local_3a8);
    __gnu_cxx::
    __normal_iterator<const_cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
    ::operator++(&local_a0,0);
  }
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndElement(xml);
  cmXMLWriter::EndDocument(xml);
  std::__cxx11::string::~string((string *)local_40);
  return 1;
}

Assistant:

int cmCTest::GenerateCTestNotesOutput(cmXMLWriter& xml,
  const cmCTest::VectorOfStrings& files)
{
  std::string buildname = cmCTest::SafeBuildIdField(
    this->GetCTestConfiguration("BuildName"));
  cmCTest::VectorOfStrings::const_iterator it;
  xml.StartDocument();
  xml.ProcessingInstruction("xml-stylesheet", "type=\"text/xsl\" "
    "href=\"Dart/Source/Server/XSL/Build.xsl "
    "<file:///Dart/Source/Server/XSL/Build.xsl> \"");
  xml.StartElement("Site");
  xml.Attribute("BuildName", buildname);
  xml.Attribute("BuildStamp", this->CurrentTag+"-"+this->GetTestModelString());
  xml.Attribute("Name", this->GetCTestConfiguration("Site"));
  xml.Attribute("Generator",std::string("ctest")+cmVersion::GetCMakeVersion());
  this->AddSiteProperties(xml);
  xml.StartElement("Notes");

  for ( it = files.begin(); it != files.end(); it ++ )
    {
    cmCTestLog(this, OUTPUT, "\tAdd file: " << *it << std::endl);
    std::string note_time = this->CurrentTime();
    xml.StartElement("Note");
    xml.Attribute("Name", *it);
    xml.Element("Time", cmSystemTools::GetTime());
    xml.Element("DateTime", note_time);
    xml.StartElement("Text");
    cmsys::ifstream ifs(it->c_str());
    if ( ifs )
      {
      std::string line;
      while ( cmSystemTools::GetLineFromStream(ifs, line) )
        {
        xml.Content(line);
        xml.Content("\n");
        }
      ifs.close();
      }
    else
      {
      xml.Content("Problem reading file: " + *it + "\n");
      cmCTestLog(this, ERROR_MESSAGE, "Problem reading file: " << *it
        << " while creating notes" << std::endl);
      }
    xml.EndElement(); // Text
    xml.EndElement(); // Note
    }
  xml.EndElement(); // Notes
  xml.EndElement(); // Site
  xml.EndDocument();
  return 1;
}